

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *stream,QCborValue *value)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_48;
  QCborValue local_30 [24];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborValue::QCborValue(local_30,value);
  QCborValue::toCbor((QByteArray *)&QStack_48,local_30,(EncodingOptions)0x0);
  operator<<(stream,(QByteArray *)&QStack_48);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48);
  QCborValue::~QCborValue(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &stream, const QCborValue &value)
{
    stream << QCborValue(value).toCbor();
    return stream;
}